

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

int __thiscall
icu_63::ResourceBundle::clone
          (ResourceBundle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ResourceBundle *this_00;
  undefined8 local_30;
  ResourceBundle *this_local;
  
  this_00 = (ResourceBundle *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  local_30 = (ResourceBundle *)0x0;
  if (this_00 != (ResourceBundle *)0x0) {
    ResourceBundle(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

ResourceBundle *
ResourceBundle::clone() const {
    return new ResourceBundle(*this);
}